

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::GetNode(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
          *this,FPortalID *key)

{
  TValueTraits<TArray<FPortalSector,_FPortalSector>_> local_49;
  undefined1 local_48 [7];
  TValueTraits<TArray<FPortalSector,_FPortalSector>_> traits;
  FPortalID local_38;
  Node *local_28;
  Node *n;
  FPortalID *key_local;
  TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
  *this_local;
  
  n = (Node *)key;
  key_local = (FPortalID *)this;
  FPortalID::FPortalID(&local_38,key);
  local_28 = FindKey(this,&local_38);
  this_local = (TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
                *)local_28;
  if (local_28 == (Node *)0x0) {
    FPortalID::FPortalID((FPortalID *)local_48,key);
    local_28 = NewKey(this,(FPortalID *)local_48);
    TValueTraits<TArray<FPortalSector,_FPortalSector>_>::Init(&local_49,&(local_28->Pair).Value);
    this_local = (TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
                  *)local_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}